

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.h
# Opt level: O2

void Statement_if(KonohaContext *kctx,KonohaStack *sfp)

{
  ktypeattr_t kVar1;
  kNode *node;
  KClass *pKVar2;
  kNameSpace *pkVar3;
  kNode *pkVar4;
  
  node = sfp[1].field_0.asNode;
  pkVar3 = kNode_GetNameSpace(kctx,node);
  pKVar2 = ((sfp[3].field_0.asObject)->h).ct;
  (*(kctx->platApi->ConsoleModule).ReportDebugMessage)
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/syntax.h"
             ,"Statement_if",0x399,"tracing..");
  pkVar4 = (*kctx->klib->TypeCheckNodeByName)
                     (kctx,node,0xe000000a,pkVar3,
                      *(KClass **)((kctx->share->classTable).field_1.bytebuf + 0x18),0);
  if (pkVar4->nodeType != 0x18) {
    pkVar4 = (*kctx->klib->TypeCheckNodeByName)(kctx,node,0xe000000b,pkVar3,pKVar2,8);
    if ((pkVar4 != (kNode *)0x0) && (pkVar4->nodeType != 0x18)) {
      (*kctx->klib->TypeCheckNodeByName)
                (kctx,node,0x26,pkVar3,
                 *(KClass **)
                  ((kctx->share->classTable).field_1.bytebuf +
                  (ulong)(pkVar4->typeAttr & 0xfffffff) * 8),8);
      if (node->nodeType != 0x18) {
        kVar1 = pkVar4->typeAttr;
        node->nodeType = 0xe;
        node->typeAttr = kVar1;
      }
      sfp[-4].field_0.asNode = node;
      (*kctx->klib->CheckSafePoint)(kctx,sfp,0);
      return;
    }
  }
  return;
}

Assistant:

static KMETHOD Statement_if(KonohaContext *kctx, KonohaStack *sfp)
{
	VAR_TypeCheck(stmt, ns, reqc);
	kNode *condNode = KLIB TypeCheckNodeByName(kctx, stmt, KSymbol_ExprPattern, ns, KClass_Boolean, 0);
	if(!kNode_IsError(condNode)) {
		kNode *thenNode = KLIB TypeCheckNodeByName(kctx, stmt, KSymbol_BlockPattern, ns, reqc, TypeCheckPolicy_AllowEmpty);
		if(thenNode != NULL && !kNode_IsError(thenNode)) {
			KLIB TypeCheckNodeByName(kctx, stmt, KSymbol_else, ns, KClass_(thenNode->typeAttr), TypeCheckPolicy_AllowEmpty);
			KReturn(kNode_Type(stmt, KNode_If, thenNode->typeAttr));
		}
	}
}